

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O1

void appendNonbasicColsToBasis(HighsLp *lp,SimplexBasis *basis,HighsInt XnumNewCol)

{
  vector<signed_char,_std::allocator<signed_char>_> *this;
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  double dVar1;
  double val;
  int iVar2;
  pointer piVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  size_type __new_size;
  int iVar10;
  
  if (XnumNewCol != 0) {
    iVar10 = lp->num_col_ + XnumNewCol;
    lVar9 = (long)iVar10;
    __new_size = lp->num_row_ + lVar9;
    this = &basis->nonbasicFlag_;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(this,__new_size);
    this_00 = &basis->nonbasicMove_;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(this_00,__new_size);
    if (0 < (long)lp->num_row_) {
      lVar8 = (long)lp->num_row_ + 1;
      do {
        piVar3 = (basis->basicIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = piVar3[lVar8 + -2];
        if (lp->num_col_ <= iVar2) {
          piVar3[lVar8 + -2] = iVar2 + XnumNewCol;
        }
        pcVar4 = (this->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar4[lVar8 + -2 + lVar9] = pcVar4[lVar8 + -2 + (long)lp->num_col_];
        pcVar4 = (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar4[lVar8 + -2 + lVar9] = pcVar4[lVar8 + -2 + (long)lp->num_col_];
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    iVar2 = lp->num_col_;
    lVar9 = (long)iVar2;
    if (iVar2 < iVar10) {
      iVar10 = iVar10 - iVar2;
      do {
        (this->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar9] = '\x01';
        dVar1 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9];
        val = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
        if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) {
          bVar5 = highs_isInfinity(-dVar1);
          bVar6 = highs_isInfinity(val);
          if (bVar5) {
            bVar7 = bVar6 - 1;
          }
          else {
            bVar7 = 1;
            if (!bVar6) {
              bVar7 = -(ABS(val) <= ABS(dVar1)) | 1;
            }
          }
        }
        else {
          bVar7 = 0;
        }
        (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar9] = bVar7;
        lVar9 = lVar9 + 1;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
  }
  return;
}

Assistant:

void appendNonbasicColsToBasis(HighsLp& lp, SimplexBasis& basis,
                               HighsInt XnumNewCol) {
  // Add nonbasic structurals
  if (XnumNewCol == 0) return;
  HighsInt newNumCol = lp.num_col_ + XnumNewCol;
  HighsInt newNumTot = newNumCol + lp.num_row_;
  basis.nonbasicFlag_.resize(newNumTot);
  basis.nonbasicMove_.resize(newNumTot);
  // Shift the row data in basicIndex, nonbasicFlag and nonbasicMove if
  // necessary
  for (HighsInt iRow = lp.num_row_ - 1; iRow >= 0; iRow--) {
    HighsInt iCol = basis.basicIndex_[iRow];
    if (iCol >= lp.num_col_) {
      // This basic variable is a row, so shift its index
      basis.basicIndex_[iRow] += XnumNewCol;
    }
    basis.nonbasicFlag_[newNumCol + iRow] =
        basis.nonbasicFlag_[lp.num_col_ + iRow];
    basis.nonbasicMove_[newNumCol + iRow] =
        basis.nonbasicMove_[lp.num_col_ + iRow];
  }
  // Make any new columns nonbasic
  for (HighsInt iCol = lp.num_col_; iCol < newNumCol; iCol++) {
    basis.nonbasicFlag_[iCol] = kNonbasicFlagTrue;
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    int8_t move = kIllegalMoveValue;
    if (lower == upper) {
      // Fixed
      move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        if (fabs(lower) < fabs(upper)) {
          move = kNonbasicMoveUp;
        } else {
          move = kNonbasicMoveDn;
        }
      } else {
        // Lower (since upper bound is infinite)
        move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      move = kNonbasicMoveDn;
    } else {
      // FREE
      move = kNonbasicMoveZe;
    }
    assert(move != kIllegalMoveValue);
    basis.nonbasicMove_[iCol] = move;
  }
}